

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int get_a32_user_mem_index(DisasContext_conflict1 *s)

{
  uint uVar1;
  DisasContext_conflict1 *s_local;
  
  uVar1 = s->mmu_idx - ARMMMUIdx_E10_0;
  if (uVar1 < 0x37 || s->mmu_idx == ARMMMUIdx_MSPrivNegPri) {
    switch((long)&switchD_007a3113::switchdataD_013786cc +
           (long)(int)(&switchD_007a3113::switchdataD_013786cc)[uVar1]) {
    case 0x7a3115:
      s_local._4_4_ = arm_to_core_mmu_idx(ARMMMUIdx_E10_0);
      break;
    case 0x7a3124:
      s_local._4_4_ = arm_to_core_mmu_idx(ARMMMUIdx_SE10_0);
      break;
    case 0x7a3133:
      s_local._4_4_ = arm_to_core_mmu_idx(ARMMMUIdx_MUser);
      break;
    case 0x7a3142:
      s_local._4_4_ = arm_to_core_mmu_idx(ARMMMUIdx_MUserNegPri);
      break;
    case 0x7a3151:
      s_local._4_4_ = arm_to_core_mmu_idx(ARMMMUIdx_MSUser);
      break;
    case 0x7a3160:
      s_local._4_4_ = arm_to_core_mmu_idx(ARMMMUIdx_MSUserNegPri);
      break;
    default:
      goto LAB_007a3171;
    }
    return s_local._4_4_;
  }
LAB_007a3171:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
             ,0xa2,(char *)0x0);
}

Assistant:

static inline int get_a32_user_mem_index(DisasContext *s)
{
    /* Return the core mmu_idx to use for A32/T32 "unprivileged load/store"
     * insns:
     *  if PL2, UNPREDICTABLE (we choose to implement as if PL0)
     *  otherwise, access as if at PL0.
     */
    switch (s->mmu_idx) {
    case ARMMMUIdx_E2:        /* this one is UNPREDICTABLE */
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
        return arm_to_core_mmu_idx(ARMMMUIdx_E10_0);
    case ARMMMUIdx_SE3:
    case ARMMMUIdx_SE10_0:
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
        return arm_to_core_mmu_idx(ARMMMUIdx_SE10_0);
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MPriv:
        return arm_to_core_mmu_idx(ARMMMUIdx_MUser);
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MPrivNegPri:
        return arm_to_core_mmu_idx(ARMMMUIdx_MUserNegPri);
    case ARMMMUIdx_MSUser:
    case ARMMMUIdx_MSPriv:
        return arm_to_core_mmu_idx(ARMMMUIdx_MSUser);
    case ARMMMUIdx_MSUserNegPri:
    case ARMMMUIdx_MSPrivNegPri:
        return arm_to_core_mmu_idx(ARMMMUIdx_MSUserNegPri);
    default:
        g_assert_not_reached();
        // never reach here
        return 0;
    }
}